

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,longdouble kappa,
          longdouble delta,longdouble theta,longdouble obj_amp)

{
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  bool bVar5;
  int selected;
  undefined8 uVar6;
  rc_size rVar7;
  undefined8 extraout_RAX;
  _Head_base<0UL,_int_*,_false> _Var8;
  long lVar9;
  rc_data *__last;
  rc_size rVar10;
  rc_data *__first;
  longdouble in_ST0;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar12;
  rc_size local_a8;
  longdouble local_9c;
  undefined1 local_90 [20];
  longdouble local_7c;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_70;
  int *local_68;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_60;
  long local_58;
  undefined8 local_50;
  longdouble local_48;
  longdouble local_3c;
  
  local_3c = delta;
  local_48 = kappa;
  if (first._M_current == last._M_current) {
    uVar6 = 0;
  }
  else {
    local_60._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )((long)this + 0x10);
    uVar6 = 0;
    local_9c = obj_amp;
    local_7c = theta;
    lVar12 = in_ST4;
    local_70._M_head_impl = (row_value *)last._M_current;
    do {
      if (*(int *)(this + 0x88) <= *first._M_current) {
        push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_58 = (long)*first._M_current;
      local_50 = uVar6;
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)local_90,
                 (int)local_60._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                      _M_head_impl);
      if (local_90._8_8_ != local_90._0_8_) {
        lVar9 = *(long *)(this + 0x50);
        _Var8._M_head_impl = (int *)local_90._8_8_;
        do {
          *(longdouble *)(lVar9 + (long)*_Var8._M_head_impl * 0x10) =
               *(longdouble *)(lVar9 + (long)*_Var8._M_head_impl * 0x10) * local_7c;
          _Var8._M_head_impl = _Var8._M_head_impl + 8;
        } while (_Var8._M_head_impl != (int *)local_90._0_8_);
      }
      rVar7 = solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                          *)this,(row_iterator)local_90._8_8_,(row_iterator)local_90._0_8_,x);
      local_a8 = rVar7;
      if (rVar7.r_size != 0) {
        lVar9 = 0;
        rVar10.r_size = 0;
        rVar10.c_size = 0;
        lVar11 = in_ST0;
        lVar1 = in_ST1;
        lVar2 = in_ST2;
        lVar3 = in_ST3;
        lVar4 = in_ST4;
        in_ST4 = lVar12;
        do {
          in_ST3 = lVar4;
          in_ST2 = lVar3;
          in_ST1 = lVar2;
          in_ST0 = lVar1;
          quadratic_cost_type<long_double>::operator()
                    (*(longdouble **)(this + 0x80),
                     (quadratic_cost_type<long_double> *)
                     (ulong)(uint)((row_iterator)
                                  (local_90._8_8_ +
                                  (long)*(int *)(*(long *)(this + 0x68) + 0x14 + lVar9) * 8))->
                                  column,(int)x,(bit_array *)local_90._8_8_);
          *(longdouble *)(*(long *)(this + 0x68) + lVar9) =
               *(longdouble *)(*(long *)(this + 0x68) + lVar9) + local_9c * lVar11;
          rVar10 = (rc_size)((long)rVar10 + 1);
          rVar7 = (rc_size)((ulong)local_a8 & 0xffffffff);
          lVar9 = lVar9 + 0x20;
          lVar11 = in_ST0;
          lVar1 = in_ST1;
          lVar2 = in_ST2;
          lVar3 = in_ST3;
          lVar4 = in_ST4;
          lVar12 = in_ST4;
        } while (rVar10 != rVar7);
      }
      if (1 < rVar7.r_size) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        __first = *(rc_data **)(this + 0x68);
        lVar9 = (long)rVar7.r_size;
        local_68 = first._M_current;
        std::
        __introsort_loop<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar9,(int)LZCOUNT(lVar9) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar9);
        __last = __first + 1;
        lVar9 = lVar9 * 0x20 + -0x20;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar9 = lVar9 + -0x20;
        } while (lVar9 != 0);
        std::
        shuffle<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
        first._M_current = local_68;
        last._M_current = &(local_70._M_head_impl)->value;
      }
      lVar9 = local_58;
      selected = solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                 ::select_variables((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                                     *)this,&local_a8,
                                    *(int *)(*(long *)(this + 0x70) + local_58 * 0xc),
                                    *(int *)(*(long *)(this + 0x70) + 4 + local_58 * 0xc));
      bVar5 = affect<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                          *)this,x,(row_value *)local_90._8_8_,(int)lVar9,selected,local_a8.r_size,
                         local_48,local_3c);
      uVar6 = CONCAT71((int7)((ulong)local_50 >> 8),(byte)local_50 | bVar5);
      first._M_current = first._M_current + 1;
    } while (first._M_current != last._M_current);
  }
  return (bool)((byte)uVar6 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }